

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3.h
# Opt level: O3

bool __thiscall esfera::acerto(esfera *this,raio *raio,double tMin,double tMax,acerto *acerto)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar3 = (raio->origem).e[0] - (this->centro).e[0];
  dVar5 = (raio->origem).e[1] - (this->centro).e[1];
  dVar8 = (raio->origem).e[2] - (this->centro).e[2];
  dVar2 = (raio->direcao).e[0];
  dVar9 = (raio->direcao).e[1];
  dVar4 = (raio->direcao).e[2];
  dVar7 = dVar4 * dVar4 + dVar2 * dVar2 + dVar9 * dVar9;
  dVar9 = dVar4 * dVar8 + dVar9 * dVar5 + dVar3 * dVar2;
  dVar2 = dVar9 * dVar9 -
          ((dVar8 * dVar8 + dVar3 * dVar3 + dVar5 * dVar5) - this->raioEsfera * this->raioEsfera) *
          dVar7;
  if (dVar2 < 0.0) {
    return false;
  }
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar4 = (-dVar9 - dVar2) / dVar7;
  if ((dVar4 < tMin) || (tMax < dVar4)) {
    dVar4 = (dVar2 - dVar9) / dVar7;
    if (dVar4 < tMin) {
      return false;
    }
    if (tMax < dVar4) {
      return false;
    }
  }
  acerto->t = dVar4;
  dVar2 = (raio->direcao).e[2] * dVar4 + (raio->origem).e[2];
  dVar3 = dVar4 * (raio->direcao).e[0] + (raio->origem).e[0];
  dVar5 = dVar4 * (raio->direcao).e[1] + (raio->origem).e[1];
  (acerto->ponto).e[0] = dVar3;
  (acerto->ponto).e[1] = dVar5;
  (acerto->ponto).e[2] = dVar2;
  dVar9 = 1.0 / this->raioEsfera;
  dVar2 = (dVar2 - (this->centro).e[2]) * dVar9;
  dVar4 = dVar9 * (dVar3 - (this->centro).e[0]);
  dVar9 = dVar9 * (dVar5 - (this->centro).e[1]);
  dVar3 = (raio->direcao).e[2] * dVar2 + (raio->direcao).e[0] * dVar4 + dVar9 * (raio->direcao).e[1]
  ;
  acerto->faceFrontal = dVar3 < 0.0;
  if (0.0 <= dVar3) {
    dVar2 = -dVar2;
  }
  uVar1 = (uint)(dVar3 < 0.0);
  auVar6._0_8_ = CONCAT44((int)(uVar1 << 0x1f) >> 0x1f,(int)(uVar1 << 0x1f) >> 0x1f);
  auVar6._8_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  auVar6._12_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  (acerto->normal).e[0] = (double)(~auVar6._0_8_ & (ulong)-dVar4 | (ulong)dVar4 & auVar6._0_8_);
  (acerto->normal).e[1] = (double)(~auVar6._8_8_ & (ulong)-dVar9 | (ulong)dVar9 & auVar6._8_8_);
  (acerto->normal).e[2] = dVar2;
  return true;
}

Assistant:

inline vector3 operator-(const vector3 &u, const vector3 &v) {
    return {u.e[0] - v.e[0], u.e[1] - v.e[1], u.e[2] - v.e[2]};
}